

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppOptions::initOptions(ClaspAppOptions *this,OptionContext *root)

{
  byte_t *pbVar1;
  StoredValue<bool> *pSVar2;
  OptionInitHelper *pOVar3;
  CustomValue *pCVar4;
  Value *pVVar5;
  StoredValue<unsigned_int> *pSVar6;
  StoredValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar7;
  StoredValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *val;
  StoredValue<int> *this_00;
  OptionGroup basic;
  allocator local_79;
  string local_78;
  OptionGroup local_58;
  
  std::__cxx11::string::string((string *)&local_78,"Basic Options",&local_79);
  Potassco::ProgramOptions::OptionGroup::OptionGroup(&local_58,&local_78,desc_level_default);
  std::__cxx11::string::~string((string *)&local_78);
  local_78._M_dataplus._M_p = (pointer)Potassco::ProgramOptions::OptionGroup::addOptions(&local_58);
  pSVar2 = Potassco::ProgramOptions::flag(&this->printPort,Potassco::ProgramOptions::store_true);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     ((OptionInitHelper *)&local_78,"print-portfolio,@1",&pSVar2->super_Value,
                      "Print default portfolio and exit");
  pCVar4 = Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>(this,mappedOpts);
  pVVar5 = Potassco::ProgramOptions::Value::implicit(&pCVar4->super_Value,"2,2,2");
  pVVar5 = Potassco::ProgramOptions::Value::arg(pVVar5,"<levels>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"quiet,q",pVVar5,
                      "Configure printing of models, costs, and calls\n      %A: <mod>[,<cost>][,<call>]\n        <mod> : print {0=all|1=last|2=no} models\n        <cost>: print {0=all|1=last|2=no} optimize values [<mod>]\n        <call>: print {0=all|1=last|2=no} call steps      [2]"
                     );
  pCVar4 = Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>(this,mappedOpts);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pCVar4->super_Value,"<fmt>");
  pVVar5 = Potassco::ProgramOptions::Value::implicit(pVVar5,"aspif");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"pre",pVVar5,
                      "Print simplified program and exit\n      %A: Set output format to {aspif|smodels} (implicit: %I)"
                     );
  pSVar6 = Potassco::ProgramOptions::storeTo<unsigned_int>
                     (&this->outf,Potassco::string_cast<unsigned_int>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar6->super_Value,"<n>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"outf,@1",pVVar5,"Use {0=default|1=competition|2=JSON|3=no} output");
  pSVar7 = Potassco::ProgramOptions::storeTo<std::__cxx11::string>
                     (&this->outAtom,Potassco::string_cast<std::__cxx11::string>);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"out-atomf,@2",&pSVar7->super_Value,
                      "Set atom format string (<Pre>?%%0<Post>?)");
  pCVar4 = Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>(this,mappedOpts);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"out-ifs,@2",&pCVar4->super_Value,"Set internal field separator");
  pSVar2 = Potassco::ProgramOptions::flag(&this->hideAux,Potassco::ProgramOptions::store_true);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"out-hide-aux,@1",&pSVar2->super_Value,
                      "Hide auxiliary atoms in answers");
  pSVar7 = Potassco::ProgramOptions::storeTo<std::__cxx11::string>
                     (&this->lemmaIn,Potassco::string_cast<std::__cxx11::string>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar7->super_Value,"<file>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-in,@1",pVVar5,"Read additional lemmas from %A");
  pSVar7 = Potassco::ProgramOptions::storeTo<std::__cxx11::string>
                     (&this->lemmaLog,Potassco::string_cast<std::__cxx11::string>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar7->super_Value,"<file>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-out,@1",pVVar5,"Log learnt lemmas to %A");
  pSVar6 = Potassco::ProgramOptions::storeTo<unsigned_int>
                     (&(this->lemma).lbdMax,Potassco::string_cast<unsigned_int>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar6->super_Value,"<n>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-out-lbd,@2",pVVar5,"Only log lemmas with lbd <= %A");
  pSVar6 = Potassco::ProgramOptions::storeTo<unsigned_int>
                     (&(this->lemma).logMax,Potassco::string_cast<unsigned_int>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar6->super_Value,"<n>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-out-max,@2",pVVar5,"Stop logging after %A lemmas");
  pCVar4 = Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>(this,mappedOpts);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-out-dom,@2",&pCVar4->super_Value,
                      "Log lemmas over <arg {input|output}> variables");
  pSVar2 = Potassco::ProgramOptions::flag
                     (&(this->lemma).logText,Potassco::ProgramOptions::store_true);
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"lemma-out-txt,@2",&pSVar2->super_Value,
                      "Log lemmas as ground integrity constraints");
  pSVar7 = Potassco::ProgramOptions::storeTo<std::__cxx11::string>
                     (&this->hccOut,Potassco::string_cast<std::__cxx11::string>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&pSVar7->super_Value,"<file>");
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"hcc-out,@2",pVVar5,"Write non-hcf programs to %A.#scc");
  val = Potassco::ProgramOptions::
        storeTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&this->input,
                   Potassco::
                   string_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  );
  pbVar1 = &(val->super_Value).flags_;
  *pbVar1 = *pbVar1 | 4;
  pOVar3 = Potassco::ProgramOptions::OptionInitHelper::operator()
                     (pOVar3,"file,f,@3",&val->super_Value,"Input files");
  this_00 = Potassco::ProgramOptions::storeTo<int>(&this->compute,Potassco::string_cast<int>);
  pVVar5 = Potassco::ProgramOptions::Value::arg(&this_00->super_Value,"<lit>");
  Potassco::ProgramOptions::OptionInitHelper::operator()
            (pOVar3,"compute,@2",pVVar5,"Force given literal to true");
  Potassco::ProgramOptions::OptionContext::add(root,&local_58);
  Potassco::ProgramOptions::OptionGroup::~OptionGroup(&local_58);
  return;
}

Assistant:

void ClaspAppOptions::initOptions(Potassco::ProgramOptions::OptionContext& root) {
	using namespace Potassco::ProgramOptions;
	OptionGroup basic("Basic Options");
	basic.addOptions()
		("print-portfolio,@1", flag(printPort), "Print default portfolio and exit")
		("quiet,q"    , notify(this, &ClaspAppOptions::mappedOpts)->implicit("2,2,2")->arg("<levels>"),
		 "Configure printing of models, costs, and calls\n"
		 "      %A: <mod>[,<cost>][,<call>]\n"
		 "        <mod> : print {0=all|1=last|2=no} models\n"
		 "        <cost>: print {0=all|1=last|2=no} optimize values [<mod>]\n"
		 "        <call>: print {0=all|1=last|2=no} call steps      [2]")
		("pre", notify(this, &ClaspAppOptions::mappedOpts)->arg("<fmt>")->implicit("aspif"), "Print simplified program and exit\n"
		 "      %A: Set output format to {aspif|smodels} (implicit: %I)")
		("outf,@1", storeTo(outf)->arg("<n>"), "Use {0=default|1=competition|2=JSON|3=no} output")
		("out-atomf,@2" , storeTo(outAtom), "Set atom format string (<Pre>?%%0<Post>?)")
		("out-ifs,@2"   , notify(this, &ClaspAppOptions::mappedOpts), "Set internal field separator")
		("out-hide-aux,@1" , flag(hideAux), "Hide auxiliary atoms in answers")
		("lemma-in,@1"     , storeTo(lemmaIn)->arg("<file>"), "Read additional lemmas from %A")
		("lemma-out,@1"    , storeTo(lemmaLog)->arg("<file>"), "Log learnt lemmas to %A")
		("lemma-out-lbd,@2", storeTo(lemma.lbdMax)->arg("<n>"), "Only log lemmas with lbd <= %A")
		("lemma-out-max,@2", storeTo(lemma.logMax)->arg("<n>"), "Stop logging after %A lemmas")
		("lemma-out-dom,@2", notify(this, &ClaspAppOptions::mappedOpts), "Log lemmas over <arg {input|output}> variables")
		("lemma-out-txt,@2", flag(lemma.logText), "Log lemmas as ground integrity constraints")
		("hcc-out,@2", storeTo(hccOut)->arg("<file>"), "Write non-hcf programs to %A.#scc")
		("file,f,@3" , storeTo(input)->composing(), "Input files")
		("compute,@2", storeTo(compute)->arg("<lit>"), "Force given literal to true")
	;
	root.add(basic);
}